

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int fp_enc_row_mt_worker_hook(void *arg1,void *unused)

{
  int *piVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  AV1_COMP *cpi;
  pthread_mutex_t *__mutex;
  TileDataEnc *pTVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  TileDataEnc *pTVar21;
  TileDataEnc *tile;
  int iVar22;
  
  cpi = *arg1;
  iVar18 = *(int *)((long)arg1 + 0x1cc);
  __mutex = (cpi->mt_info).enc_row_mt.mutex_;
  *(long *)(*(long *)((long)arg1 + 8) + 0x2b90) = (long)arg1 + 0x18;
  iVar10 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar10 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    iVar18 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[iVar18];
    BVar2 = cpi->fp_block_size;
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2];
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((cpi->mt_info).enc_row_mt.firstpass_mt_exit == false) {
      do {
        pTVar7 = cpi->tile_data;
        lVar14 = (long)iVar18;
        iVar10 = pTVar7[lVar14].row_mt_sync.next_mi_row;
        if (iVar10 < pTVar7[lVar14].tile_info.mi_row_end) {
LAB_001c2324:
          piVar1 = &pTVar7[lVar14].row_mt_sync.num_threads_working;
          *piVar1 = *piVar1 + 1;
          pTVar7[lVar14].row_mt_sync.next_mi_row = iVar10 + (uint)bVar3;
        }
        else {
          lVar14 = (long)(cpi->common).tiles.rows;
          if (lVar14 < 1) break;
          uVar4 = (cpi->common).tiles.cols;
          iVar10 = 0x7fffffff;
          iVar18 = -1;
          iVar20 = 0;
          lVar17 = 0;
          iVar19 = 0;
          pTVar21 = pTVar7;
          do {
            uVar16 = (ulong)uVar4;
            tile = pTVar21;
            iVar22 = iVar20;
            iVar11 = iVar18;
            if (0 < (int)uVar4) {
              do {
                iVar18 = av1_get_unit_rows_in_tile(&tile->tile_info,BVar2);
                iVar12 = av1_get_unit_cols_in_tile(&tile->tile_info,BVar2);
                iVar12 = iVar12 + 1 >> 1;
                if (iVar18 <= iVar12) {
                  iVar12 = iVar18;
                }
                iVar5 = (tile->row_mt_sync).num_threads_working;
                iVar9 = iVar19;
                iVar18 = iVar11;
                if ((iVar5 < iVar12) &&
                   (iVar12 = (tile->tile_info).mi_row_end, iVar6 = (tile->row_mt_sync).next_mi_row,
                   iVar13 = iVar12 - iVar6, iVar13 != 0 && iVar6 <= iVar12)) {
                  iVar18 = iVar10;
                  if (iVar5 < iVar10) {
                    iVar19 = 0;
                    iVar18 = iVar5;
                  }
                  bVar8 = iVar10 < iVar5;
                  iVar9 = iVar13;
                  iVar10 = iVar18;
                  iVar18 = iVar22;
                  if (bVar8 || iVar13 <= iVar19) {
                    iVar9 = iVar19;
                    iVar18 = iVar11;
                  }
                }
                iVar19 = iVar9;
                iVar22 = iVar22 + 1;
                tile = tile + 1;
                uVar16 = uVar16 - 1;
                iVar11 = iVar18;
              } while (uVar16 != 0);
            }
            lVar17 = lVar17 + 1;
            iVar20 = iVar20 + uVar4;
            pTVar21 = pTVar21 + uVar4;
          } while (lVar17 != lVar14);
          if (iVar18 == -1) break;
          lVar14 = (long)iVar18;
          iVar10 = pTVar7[lVar14].row_mt_sync.next_mi_row;
          if (iVar10 < pTVar7[lVar14].tile_info.mi_row_end) goto LAB_001c2324;
          iVar10 = -1;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pTVar7 = cpi->tile_data;
        av1_first_pass_row(cpi,*(ThreadData_conflict **)((long)arg1 + 8),pTVar7 + iVar18,
                           iVar10 >> (""[BVar2] & 0x1f),BVar2);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        piVar1 = &pTVar7[iVar18].row_mt_sync.num_threads_working;
        *piVar1 = *piVar1 + -1;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
      } while ((cpi->mt_info).enc_row_mt.firstpass_mt_exit != true);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar18 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (cpi->mt_info).enc_row_mt.firstpass_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar14 = (long)(cpi->common).tiles.rows;
    if (0 < lVar14) {
      BVar2 = cpi->fp_block_size;
      bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2];
      uVar4 = (cpi->common).tiles.cols;
      lVar17 = 0;
      do {
        if (0 < (int)uVar4) {
          lVar15 = lVar17 * (ulong)uVar4;
          uVar16 = 0;
          do {
            pTVar7 = cpi->tile_data;
            iVar10 = av1_get_unit_cols_in_tile(&pTVar7[uVar16 + lVar15].tile_info,BVar2);
            iVar18 = pTVar7[uVar16 + lVar15].tile_info.mi_row_start;
            if (iVar18 < pTVar7[uVar16 + lVar15].tile_info.mi_row_end) {
              iVar20 = 0;
              do {
                iVar18 = iVar18 + (uint)bVar3;
                (*(cpi->mt_info).enc_row_mt.sync_write_ptr)
                          (&pTVar7[uVar16 + lVar15].row_mt_sync,iVar20,iVar10 + -1,iVar10);
                iVar20 = iVar20 + 1;
              } while (iVar18 < pTVar7[uVar16 + lVar15].tile_info.mi_row_end);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar4);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar14);
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

static int fp_enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->firstpass_mt_exit = true;
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_firstpass_encode_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  AV1_COMMON *const cm = &cpi->common;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];
  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  const int unit_height = mi_size_high[fp_block_size];
  int end_of_frame = 0;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
    if (!firstpass_mt_exit && !get_next_job(&cpi->tile_data[cur_tile_id],
                                            &current_mi_row, unit_height)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 1,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When firstpass_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (firstpass_mt_exit || end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    ThreadData *td = thread_data->td;

    assert(current_mi_row != -1 &&
           current_mi_row < this_tile->tile_info.mi_row_end);

    const int unit_height_log2 = mi_size_high_log2[fp_block_size];
    av1_first_pass_row(cpi, td, this_tile, current_mi_row >> unit_height_log2,
                       fp_block_size);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}